

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

bool XipFile::isXipFile(ReadWriter_ptr *r,uint32_t rvabase)

{
  element_type *peVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  char *__format;
  uint32_t uVar5;
  bool bVar6;
  
  peVar1 = (r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_ReadWriter[4])(peVar1,0x40);
  uVar2 = ReadWriter::read32le
                    ((r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (uVar2 == 0x43454345) {
    uVar2 = ReadWriter::read32le
                      ((r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    uVar3 = ReadWriter::read32le
                      ((r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if (uVar3 != 0 || uVar2 != 0) {
      uVar5 = uVar2 - rvabase;
      if (uVar3 != 0) {
        uVar5 = uVar3;
      }
      if (rvabase == 0) {
        uVar5 = uVar3;
      }
      peVar1 = (r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar1->_vptr_ReadWriter[4])(peVar1,(ulong)(uVar5 + 8));
      uVar3 = ReadWriter::read32le
                        ((r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      bVar6 = uVar3 == uVar2 - uVar5;
      if (!bVar6) {
        if (1 < g_verbose) {
          printf("not xip: p1(0x%x) != hrva(0x%x)-hofs(0x%x) == 0x%x\n",(ulong)uVar3,(ulong)uVar2,
                 (ulong)uVar5);
          return bVar6;
        }
        return bVar6;
      }
      return bVar6;
    }
    if (g_verbose < 2) {
      return false;
    }
    __format = "not xip: hdrofs=0x%x\n";
    uVar4 = 0;
  }
  else {
    if (g_verbose < 2) {
      return false;
    }
    __format = "not xip: ecec=0x%x\n";
    uVar4 = (ulong)uVar2;
  }
  printf(__format,uVar4);
  return false;
}

Assistant:

static bool isXipFile(ReadWriter_ptr r, uint32_t rvabase)
    {
        r->setpos(0x40);
        uint32_t ecec= r->read32le();
        if (ecec!=0x43454345) {
            if (g_verbose > 1)
                printf("not xip: ecec=0x%x\n", ecec);
            return false;
        }
        uint32_t hdrrva= r->read32le();
        uint32_t hdrofs= r->read32le();
        if (hdrrva==0 && hdrofs==0) {
            if (g_verbose > 1)
                printf("not xip: hdrofs=0x%x\n", hdrofs);
            return false;
        }
        if (rvabase && hdrofs==0)
            hdrofs= hdrrva-rvabase;
        else if (rvabase==0)
            rvabase= hdrrva-hdrofs;

        r->setpos(hdrofs+8);
        uint32_t physfirst= r->read32le();

        if (physfirst != hdrrva-hdrofs) {
            if (g_verbose > 1)
                printf("not xip: p1(0x%x) != hrva(0x%x)-hofs(0x%x) == 0x%x\n", physfirst, hdrrva, hdrofs, hdrrva-hdrofs);
            return false;
        }

        return true;
    }